

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

void __thiscall pg::SSPMSolver::stream_pm(SSPMSolver *this,ostream *out,int idx)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = (long)idx * (long)this->l;
  if (this->pm_d[lVar5] == -1) {
    pcVar2 = " \x1b[1;33mTop\x1b[m";
  }
  else {
    std::operator<<(out," { ");
    lVar3 = 0;
    for (iVar4 = 0; iVar4 < this->h; iVar4 = iVar4 + 1) {
      if (iVar4 != 0) {
        std::operator<<(out,",");
      }
      iVar1 = 0;
      for (lVar3 = (long)(int)lVar3; (lVar3 < this->l && (this->pm_d[lVar5 + lVar3] == iVar4));
          lVar3 = lVar3 + 1) {
        std::ostream::_M_insert<bool>(SUB81(out,0));
        iVar1 = iVar1 + -1;
      }
      if (iVar1 == 0) {
        std::operator<<(out,anon_var_dwarf_1cdf6d);
      }
    }
    pcVar2 = " }";
  }
  std::operator<<(out,pcVar2);
  return;
}

Assistant:

void
SSPMSolver::stream_pm(std::ostream &out, int idx)
{
    int base = idx*l;
    if (pm_d[base] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and pm_d[base+j] == i) {
                c++;
                out << pm_b[base+j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";
    }
}